

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

BUFFER_HANDLE mqtt_codec_ping(void)

{
  int iVar1;
  uchar *puVar2;
  uint8_t *iterator;
  BUFFER_HANDLE result;
  
  iterator = (uint8_t *)BUFFER_new();
  if ((BUFFER_HANDLE)iterator != (BUFFER_HANDLE)0x0) {
    iVar1 = BUFFER_enlarge((BUFFER_HANDLE)iterator,2);
    if (iVar1 == 0) {
      puVar2 = BUFFER_u_char((BUFFER_HANDLE)iterator);
      if (puVar2 == (uchar *)0x0) {
        BUFFER_delete((BUFFER_HANDLE)iterator);
        iterator = (uint8_t *)0x0;
      }
      else {
        *puVar2 = 0xc0;
        puVar2[1] = '\0';
      }
    }
    else {
      BUFFER_delete((BUFFER_HANDLE)iterator);
      iterator = (uint8_t *)0x0;
    }
  }
  return (BUFFER_HANDLE)iterator;
}

Assistant:

BUFFER_HANDLE mqtt_codec_ping()
{
    /* Codes_SRS_MQTT_CODEC_07_021: [On success mqtt_codec_ping shall construct a BUFFER_HANDLE that represents a MQTT PINGREQ packet.] */
    BUFFER_HANDLE result = BUFFER_new();
    if (result != NULL)
    {
        if (BUFFER_enlarge(result, 2) != 0)
        {
            /* Codes_SRS_MQTT_CODEC_07_022: [If any error is encountered mqtt_codec_ping shall return NULL.] */
            BUFFER_delete(result);
            result = NULL;
        }
        else
        {
            uint8_t* iterator = BUFFER_u_char(result);
            if (iterator == NULL)
            {
                /* Codes_SRS_MQTT_CODEC_07_022: [If any error is encountered mqtt_codec_ping shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                iterator[0] = PINGREQ_TYPE;
                iterator[1] = 0;
            }
        }
    }
    return result;
}